

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::AutomakeReporter::skipTest(AutomakeReporter *this,TestCaseInfo *testInfo)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(*(ostream **)(in_RDI + 0x20),":test-result: SKIP ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void AutomakeReporter::skipTest(TestCaseInfo const& testInfo) {
        m_stream << ":test-result: SKIP " << testInfo.name << '\n';
    }